

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O1

int ebur128_set_channel(ebur128_state *st,uint channel_number,int value)

{
  int iVar1;
  
  iVar1 = 3;
  if (channel_number < st->channels) {
    if ((value == 6) && ((channel_number != 0 || (st->channels != 1)))) {
      ebur128_set_channel_cold_1();
    }
    else {
      st->d->channel_map[channel_number] = value;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ebur128_set_channel(ebur128_state* st,
                        unsigned int channel_number,
                        int value) {
  if (channel_number >= st->channels) {
    return EBUR128_ERROR_INVALID_CHANNEL_INDEX;
  }
  if (value == EBUR128_DUAL_MONO &&
      (st->channels != 1 || channel_number != 0)) {
    fprintf(stderr, "EBUR128_DUAL_MONO only works with mono files!\n");
    return EBUR128_ERROR_INVALID_CHANNEL_INDEX;
  }
  st->d->channel_map[channel_number] = value;
  return EBUR128_SUCCESS;
}